

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall higan::TcpServer::OnNewConnection(TcpServer *this,int socket,InetAddress *address)

{
  undefined8 this_00;
  LogLevel LVar1;
  EventLoop *loop;
  TcpConnection *this_01;
  undefined1 local_388 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_378 [65];
  undefined1 local_170 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158 [29];
  code *local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  string connection_name;
  TcpConnectionPtr connection_ptr;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                 &this->server_name_,"-");
  InetAddress::GetIpPort_abi_cxx11_((string *)local_170,address);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)local_388);
  loop = EventLoopThreadPool::GetNextEventLoop(&this->thread_pool_);
  this_01 = (TcpConnection *)operator_new(0x210);
  TcpConnection::TcpConnection(this_01,loop,(string *)local_60,socket,address);
  std::__shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<higan::TcpConnection,void>
            ((__shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)
             (connection_name.field_2._M_local_buf + 8),this_01);
  TcpConnection::SetMessageCallback
            ((TcpConnection *)connection_name.field_2._8_8_,&this->message_callback_);
  this_00 = connection_name.field_2._8_8_;
  local_170._0_8_ = OnConnectionError;
  local_170._8_8_ = 0;
  local_170._16_8_ = this;
  std::function<void(std::shared_ptr<higan::TcpConnection>const&)>::
  function<std::_Bind<void(higan::TcpServer::*(higan::TcpServer*,std::_Placeholder<1>))(std::shared_ptr<higan::TcpConnection>const&)>,void>
            ((function<void(std::shared_ptr<higan::TcpConnection>const&)> *)local_388,
             (_Bind<void_(higan::TcpServer::*(higan::TcpServer_*,_std::_Placeholder<1>))(const_std::shared_ptr<higan::TcpConnection>_&)>
              *)local_170);
  TcpConnection::SetErrorCallback((TcpConnection *)this_00,(TcpConnectionCallback *)local_388);
  std::_Function_base::~_Function_base((_Function_base *)local_388);
  TcpConnection::SetNewConnectionCallback
            ((TcpConnection *)connection_name.field_2._8_8_,&this->newconnection_callback_);
  LVar1 = Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    Logger::Logger((Logger *)local_388,INFO,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/TcpServer.cpp"
                   ,0x30,"OnNewConnection");
    Fmt::Fmt((Fmt *)local_170,"a new connection: %s create",local_60);
    Logger::operator<<((Logger *)local_388,(Fmt *)local_170);
    Logger::~Logger((Logger *)local_388);
  }
  local_388._0_4_ = socket;
  std::__shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)(local_388 + 8),
             (__shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&connection_name.field_2 + 8));
  std::
  _Rb_tree<int,std::pair<int_const,std::shared_ptr<higan::TcpConnection>>,std::_Select1st<std::pair<int_const,std::shared_ptr<higan::TcpConnection>>>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<higan::TcpConnection>>>>
  ::_M_insert_unique<std::pair<int_const,std::shared_ptr<higan::TcpConnection>>>
            ((_Rb_tree<int,std::pair<int_const,std::shared_ptr<higan::TcpConnection>>,std::_Select1st<std::pair<int_const,std::shared_ptr<higan::TcpConnection>>>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<higan::TcpConnection>>>>
              *)&this->connection_map_,
             (pair<const_int,_std::shared_ptr<higan::TcpConnection>_> *)local_388);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_378);
  local_70 = TcpConnection::ConnectionEstablished;
  local_68 = 0;
  std::_Bind<void(higan::TcpConnection::*(std::shared_ptr<higan::TcpConnection>))()>::
  _Bind<std::shared_ptr<higan::TcpConnection>&>
            ((_Bind<void(higan::TcpConnection::*(std::shared_ptr<higan::TcpConnection>))()> *)
             local_170,(offset_in_TcpConnection_to_subr *)&local_70,
             (shared_ptr<higan::TcpConnection> *)((long)&connection_name.field_2 + 8));
  std::function<void()>::
  function<std::_Bind<void(higan::TcpConnection::*(std::shared_ptr<higan::TcpConnection>))()>,void>
            ((function<void()> *)local_388,
             (_Bind<void_(higan::TcpConnection::*(std::shared_ptr<higan::TcpConnection>))()> *)
             local_170);
  EventLoop::RunInLoop(loop,(EventLoopFunc *)local_388);
  std::_Function_base::~_Function_base((_Function_base *)local_388);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&connection_ptr);
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void TcpServer::OnNewConnection(int socket, const InetAddress& address)
{
	std::string connection_name = server_name_ + "-" + address.GetIpPort();

	EventLoop* loop = thread_pool_.GetNextEventLoop();

	TcpConnectionPtr connection_ptr(
			new TcpConnection(loop, connection_name, socket, address));

	connection_ptr->SetMessageCallback(message_callback_);
	connection_ptr->SetErrorCallback(std::bind(&TcpServer::OnConnectionError, this, _1));
	connection_ptr->SetNewConnectionCallback(newconnection_callback_);

	LOG_INFO << higan::Fmt("a new connection: %s create", connection_name.c_str());
	connection_map_.insert({socket, connection_ptr});

	/**
	 * 在新连接所属的loop中执行
	 * 这里因为是主线程运行, 所以ConnectionEstablished会被放入从线程的队列中
	 * 等待从线程执行
	 */
	loop->RunInLoop(std::bind(&TcpConnection::ConnectionEstablished, connection_ptr));
}